

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_mask_table_alloc(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  uint uVar1;
  uint in_EAX;
  PS_Mask pPVar2;
  PS_Mask pPVar3;
  uint uVar4;
  undefined8 uStack_38;
  
  uVar1 = table->num_masks + 1;
  if (table->max_masks < uVar1) {
    uStack_38 = (ulong)in_EAX;
    uVar4 = (table->num_masks & 0xfffffff8) + 8;
    pPVar2 = (PS_Mask)ft_mem_realloc(memory,0x18,(ulong)table->max_masks,(ulong)uVar4,table->masks,
                                     (FT_Error *)((long)&uStack_38 + 4));
    table->masks = pPVar2;
    if (uStack_38._4_4_ != 0) {
      pPVar3 = (PS_Mask)0x0;
      goto LAB_0020fca4;
    }
    table->max_masks = uVar4;
  }
  else {
    pPVar2 = table->masks;
  }
  pPVar3 = pPVar2 + ((ulong)uVar1 - 1);
  pPVar3->num_bits = 0;
  pPVar2[(ulong)uVar1 - 1].end_point = 0;
  table->num_masks = uVar1;
  uStack_38._4_4_ = 0;
LAB_0020fca4:
  *amask = pPVar3;
  return uStack_38._4_4_;
}

Assistant:

static FT_Error
  ps_mask_table_alloc( PS_Mask_Table  table,
                       FT_Memory      memory,
                       PS_Mask       *amask )
  {
    FT_UInt   count;
    FT_Error  error = FT_Err_Ok;
    PS_Mask   mask  = NULL;


    count = table->num_masks;
    count++;

    if ( count > table->max_masks )
    {
      error = ps_mask_table_ensure( table, count, memory );
      if ( error )
        goto Exit;
    }

    mask             = table->masks + count - 1;
    mask->num_bits   = 0;
    mask->end_point  = 0;
    table->num_masks = count;

  Exit:
    *amask = mask;
    return error;
  }